

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

void __thiscall MPEGPictureHeader::buildHeader(MPEGPictureHeader *this)

{
  uint8_t *buffer;
  BitStreamWriter bitWriter;
  BitStreamWriter local_38;
  
  local_38.super_BitStream.m_totalBits = 0;
  local_38.super_BitStream.m_buffer = (uint *)0x0;
  local_38.super_BitStream.m_initBuffer = (uint *)0x0;
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  buffer = (this->super_MPEGRawDataHeader).m_data_buffer;
  BitStream::setBuffer
            (&local_38.super_BitStream,buffer,
             buffer + (this->super_MPEGRawDataHeader).m_max_data_len);
  local_38.m_curVal = 0;
  local_38.m_bitWrited = 0;
  BitStreamWriter::putBits(&local_38,0x10,0);
  BitStreamWriter::putBits(&local_38,0x10,0x100);
  BitStreamWriter::putBits
            (&local_38,10,(uint)*(ushort *)&(this->super_MPEGRawDataHeader).field_0x1c);
  BitStreamWriter::putBits(&local_38,3,this->pict_type);
  BitStreamWriter::putBits(&local_38,0x10,(uint)this->vbv_delay);
  if ((this->pict_type & ~I_FRAME) == P_FRAME) {
    BitStreamWriter::putBits(&local_38,1,this->full_pel[0]);
    BitStreamWriter::putBits(&local_38,3,(uint)this->mpeg_f_code[0][0]);
  }
  if (this->pict_type == B_FRAME) {
    BitStreamWriter::putBits(&local_38,1,this->full_pel[1]);
    BitStreamWriter::putBits(&local_38,3,(uint)this->mpeg_f_code[1][0]);
  }
  BitStreamWriter::flushBits(&local_38);
  (this->super_MPEGRawDataHeader).m_data_buffer_len =
       (((int)(local_38.m_bitWrited +
              ((int)local_38.super_BitStream.m_buffer - (int)local_38.super_BitStream.m_initBuffer)
              * 8) >> 3) + 1) - (uint)((local_38._24_8_ & 0x700000000) == 0);
  return;
}

Assistant:

void MPEGPictureHeader::buildHeader()
{
    BitStreamWriter bitWriter{};
    bitWriter.setBuffer(m_data_buffer, m_data_buffer + m_max_data_len);

    bitWriter.putBits(16, 0);
    bitWriter.putBits(16, PICTURE_START_CODE);

    bitWriter.putBits(10, ref);
    bitWriter.putBits(3, static_cast<int>(pict_type));
    bitWriter.putBits(16, vbv_delay);

    if (pict_type == PictureCodingType::P_FRAME || pict_type == PictureCodingType::B_FRAME)
    {
        bitWriter.putBits(1, full_pel[0]);
        bitWriter.putBits(3, mpeg_f_code[0][0]);
    }
    if (pict_type == PictureCodingType::B_FRAME)
    {
        bitWriter.putBits(1, full_pel[1]);
        bitWriter.putBits(3, mpeg_f_code[1][0]);
    }
    bitWriter.flushBits();
    const int bitCnt = bitWriter.getBitsCount();
    m_data_buffer_len = (bitCnt >> 3) + (bitCnt & 7 ? 1 : 0);
}